

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathexec_env.c
# Opt level: O0

int pathexec_env(char *s,char *t)

{
  int iVar1;
  char *t_local;
  char *s_local;
  
  if (s == (char *)0x0) {
    s_local._4_4_ = 1;
  }
  else {
    iVar1 = stralloc_copys(&tmp,s);
    if (iVar1 == 0) {
      s_local._4_4_ = 0;
    }
    else {
      if (t != (char *)0x0) {
        iVar1 = stralloc_cats(&tmp,"=");
        if (iVar1 == 0) {
          return 0;
        }
        iVar1 = stralloc_cats(&tmp,t);
        if (iVar1 == 0) {
          return 0;
        }
      }
      iVar1 = stralloc_append(&tmp,"");
      if (iVar1 == 0) {
        s_local._4_4_ = 0;
      }
      else {
        s_local._4_4_ = stralloc_cat(&plus,&tmp);
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

int pathexec_env(const char *s,const char *t)
{
  if (!s) return 1;
  if (!stralloc_copys(&tmp,s)) return 0;
  if (t) {
    if (!stralloc_cats(&tmp,"=")) return 0;
    if (!stralloc_cats(&tmp,t)) return 0;
  }
  if (!stralloc_0(&tmp)) return 0;
  return stralloc_cat(&plus,&tmp);
}